

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

bool __thiscall
Trie::matchAll(Trie *this,string *src,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *outVect)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  ushort uVar3;
  pointer puVar4;
  mapped_type *pptVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  pointer puVar9;
  char cVar10;
  trie_node_t *ptVar11;
  bool bVar12;
  uint16_t index;
  string temp;
  Unicode _unicode;
  undefined2 local_7a;
  value_type local_78;
  Trie *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  ptVar11 = this->root;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (ushort *)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (ushort *)0x0;
  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = outVect;
  Limonp::utf8ToUnicode((src->_M_dataplus)._M_p,(uint)src->_M_string_length,&local_48);
  puVar4 = local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar9 = local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58 = this;
    do {
      local_7a = *puVar9;
      for (; ptVar11 != (mapped_type)0x0; ptVar11 = ptVar11->search_clue) {
        p_Var6 = (ptVar11->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var6 != (_Base_ptr)0x0) {
          p_Var1 = &(ptVar11->nextMap)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = &p_Var1->_M_header;
          do {
            bVar12 = (ushort)(short)p_Var6[1]._M_color < (ushort)local_7a;
            if (!bVar12) {
              p_Var7 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[bVar12];
          } while (p_Var6 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             ((ushort)(short)p_Var7[1]._M_color <= (ushort)local_7a)) {
            pptVar5 = std::
                      map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                      ::operator[](&ptVar11->nextMap,&local_7a);
            ptVar11 = *pptVar5;
            if (ptVar11 != (mapped_type)0x0) {
              if (ptVar11->infoIndex != -1) {
                local_78._M_string_length = 0;
                *local_78._M_dataplus._M_p = '\0';
                bVar2 = (this->lengthVect).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[ptVar11->infoIndex];
                if (bVar2 != 0) {
                  local_78._M_string_length = 0;
                  *local_78._M_dataplus._M_p = '\0';
                  lVar8 = -(ulong)((uint)bVar2 * 2);
                  do {
                    uVar3 = *(ushort *)((long)puVar9 + lVar8 + 2);
                    cVar10 = (char)&local_78;
                    if (0x7f < uVar3) {
                      if (uVar3 < 0x800) {
                        std::__cxx11::string::push_back(cVar10);
                      }
                      else {
                        std::__cxx11::string::push_back(cVar10);
                        std::__cxx11::string::push_back(cVar10);
                      }
                    }
                    std::__cxx11::string::push_back(cVar10);
                    lVar8 = lVar8 + 2;
                  } while (lVar8 != 0);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_50,&local_78);
                this = local_58;
              }
              goto LAB_00105836;
            }
            break;
          }
        }
      }
      ptVar11 = this->root;
LAB_00105836:
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (ushort *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool Trie::matchAll(const string &src, vector<string> &outVect)
{
	trie_node_t *node = root;
	uint16_t index;
    Unicode _unicode;
	decode(src, _unicode);
	auto iter = _unicode.begin();
	auto begin = iter, last = iter;
	auto end = _unicode.end();
	string temp;
    for( ; iter != end; iter++ ) {
		index = *iter;
		for ( ; ; ) {
			if ( node == NULL ) {
				break;
			} else if ( node->nextMap.find(index) == node->nextMap.end() ) {
			    node = node->search_clue;
			} else {
				node = node->nextMap[index];
				break;
			}
		}
	    if ( node == NULL ) {
			node = root;
		} else	{
			if ( node->infoIndex != -1 ) {
				temp.clear();
				last = iter - lengthVect[node->infoIndex] + 1;
                encode(last, iter+1 , temp);
                outVect.push_back(temp);
			}
		}
	}
	return true;
}